

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

uint __thiscall cmCTestGIT::GetGitVersion(cmCTestGIT *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint v [4];
  string version;
  OneLineParser version_out;
  string git;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_version;
  OutputLogger version_err;
  undefined8 local_148;
  undefined8 uStack_140;
  string local_130;
  string local_110;
  undefined1 local_f0 [32];
  long *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  long *local_a8;
  long local_a0;
  long local_98 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  OutputLogger local_70;
  
  if (this->CurrentGitVersion == 0) {
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,
               pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool.
                        _M_string_length);
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_f0,local_a8,local_a0 + (long)local_a8)
    ;
    plVar5 = (long *)(local_c8[0]._M_local_buf + 8);
    local_d0 = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--version","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_f0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,__l,(allocator_type *)&local_70);
    lVar6 = -0x40;
    do {
      if (plVar5 != (long *)plVar5[-2]) {
        operator_delete((long *)plVar5[-2],*plVar5 + 1);
      }
      plVar5 = plVar5 + -4;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0);
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    OneLineParser::OneLineParser((OneLineParser *)local_f0,this,"version-out> ",&local_110);
    cmProcessTools::OutputLogger::OutputLogger
              (&local_70,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"version-err> ");
    local_148 = 0;
    uStack_140 = 0;
    paVar1 = &local_130.field_2;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    local_130._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,&local_88,(OutputParser *)local_f0,
                                (OutputParser *)&local_70,&local_130,Auto);
    if (bVar3) {
      iVar4 = __isoc99_sscanf(local_110._M_dataplus._M_p,"git version %u.%u.%u.%u",&local_148,
                              (long)&local_148 + 4,&uStack_140,(long)&uStack_140 + 4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      if (2 < iVar4) {
        this->CurrentGitVersion =
             (int)uStack_140 * 1000 + local_148._4_4_ * 100000 + (int)local_148 * 10000000 +
             uStack_140._4_4_;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    local_70.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_00bdd8c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.super_LineParser.Line._M_dataplus._M_p !=
        &local_70.super_LineParser.Line.field_2) {
      operator_delete(local_70.super_LineParser.Line._M_dataplus._M_p,
                      local_70.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_f0._0_8_ = &PTR__LineParser_00bdd8c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._24_8_ != local_c8) {
      operator_delete((void *)local_f0._24_8_,local_c8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
  }
  return this->CurrentGitVersion;
}

Assistant:

unsigned int cmCTestGIT::GetGitVersion()
{
  if (!this->CurrentGitVersion) {
    std::string git = this->CommandLineTool;
    std::vector<std::string> git_version = { git, "--version" };
    std::string version;
    OneLineParser version_out(this, "version-out> ", version);
    OutputLogger version_err(this->Log, "version-err> ");
    unsigned int v[4] = { 0, 0, 0, 0 };
    if (this->RunChild(git_version, &version_out, &version_err) &&
        sscanf(version.c_str(), "git version %u.%u.%u.%u", &v[0], &v[1], &v[2],
               &v[3]) >= 3) {
      this->CurrentGitVersion = cmCTestGITVersion(v[0], v[1], v[2], v[3]);
    }
  }
  return this->CurrentGitVersion;
}